

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 *puVar10;
  Value *pVVar11;
  CharReader *pCVar12;
  Value *pVVar13;
  OurFeatures local_40;
  
  pVVar13 = &this->settings_;
  puVar10 = (undefined1 *)Value::find(pVVar13,"collectComments","");
  if ((Value *)puVar10 == (Value *)0x0) {
    puVar10 = kNull;
  }
  bVar1 = Value::asBool((Value *)puVar10);
  puVar10 = (undefined1 *)Value::find(pVVar13,"allowComments","");
  if ((Value *)puVar10 == (Value *)0x0) {
    puVar10 = kNull;
  }
  bVar2 = Value::asBool((Value *)puVar10);
  puVar10 = (undefined1 *)Value::find(pVVar13,"strictRoot","");
  if ((Value *)puVar10 == (Value *)0x0) {
    puVar10 = kNull;
  }
  bVar3 = Value::asBool((Value *)puVar10);
  puVar10 = (undefined1 *)Value::find(pVVar13,"allowDroppedNullPlaceholders","");
  if ((Value *)puVar10 == (Value *)0x0) {
    puVar10 = kNull;
  }
  bVar4 = Value::asBool((Value *)puVar10);
  puVar10 = (undefined1 *)Value::find(pVVar13,"allowNumericKeys","");
  if ((Value *)puVar10 == (Value *)0x0) {
    puVar10 = kNull;
  }
  bVar5 = Value::asBool((Value *)puVar10);
  puVar10 = (undefined1 *)Value::find(pVVar13,"allowSingleQuotes","");
  if ((Value *)puVar10 == (Value *)0x0) {
    puVar10 = kNull;
  }
  bVar6 = Value::asBool((Value *)puVar10);
  puVar10 = (undefined1 *)Value::find(pVVar13,"stackLimit","");
  if ((Value *)puVar10 == (Value *)0x0) {
    puVar10 = kNull;
  }
  local_40.stackLimit_ = Value::asInt((Value *)puVar10);
  puVar10 = (undefined1 *)Value::find(pVVar13,"failIfExtra","");
  if ((Value *)puVar10 == (Value *)0x0) {
    puVar10 = kNull;
  }
  bVar7 = Value::asBool((Value *)puVar10);
  puVar10 = (undefined1 *)Value::find(pVVar13,"rejectDupKeys","");
  if ((Value *)puVar10 == (Value *)0x0) {
    puVar10 = kNull;
  }
  bVar8 = Value::asBool((Value *)puVar10);
  pVVar11 = Value::find(pVVar13,"allowSpecialFloats","");
  pVVar13 = (Value *)kNull;
  if (pVVar11 != (Value *)0x0) {
    pVVar13 = pVVar11;
  }
  bVar9 = Value::asBool(pVVar13);
  local_40.failIfExtra_ = bVar7;
  local_40.allowSingleQuotes_ = bVar6;
  local_40.strictRoot_ = bVar3;
  local_40.allowComments_ = bVar2;
  local_40.allowDroppedNullPlaceholders_ = bVar4;
  local_40.allowNumericKeys_ = bVar5;
  local_40.allowSpecialFloats_ = bVar9;
  local_40.rejectDupKeys_ = bVar8;
  pCVar12 = (CharReader *)operator_new(0x130);
  pCVar12->_vptr_CharReader = (_func_int **)&PTR__OurCharReader_0012bcd0;
  *(bool *)&pCVar12[1]._vptr_CharReader = bVar1;
  OurReader::OurReader((OurReader *)(pCVar12 + 2),&local_40);
  return pCVar12;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const
{
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ = settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();
  features.stackLimit_ = settings_["stackLimit"].asInt();
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  features.allowSpecialFloats_ = settings_["allowSpecialFloats"].asBool();
  return new OurCharReader(collectComments, features);
}